

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
reallocateAndGrow(QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                  *this,GrowthPosition where,qsizetype n,
                 QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                 *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 *puVar3;
  quintptr qVar4;
  Mapping *pMVar5;
  int iVar6;
  int iVar7;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *data;
  long lVar8;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar9;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar10;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                 *)0x0 && where == GrowsAtEnd) && (pDVar1 = this->d, pDVar1 != (Data *)0x0)) &&
      (0 < n)) && ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
      ::reallocate((QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)this,n + this->size +
                           ((long)((long)this->ptr -
                                  ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) &
                                  0xfffffffffffffff0)) >> 5),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)
                   &DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0 && 0 < n)
    {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar8 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                     *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar8) {
            ppVar10 = this->ptr;
            ppVar9 = ppVar10 + lVar8;
            ppVar11 = local_48.ptr + local_48.size;
            do {
              iVar6 = (ppVar10->first).r;
              iVar7 = (ppVar10->first).c;
              qVar4 = (ppVar10->first).i;
              pMVar5 = ppVar10->second;
              (ppVar11->first).m.ptr = (ppVar10->first).m.ptr;
              ppVar11->second = pMVar5;
              (ppVar11->first).r = iVar6;
              (ppVar11->first).c = iVar7;
              (ppVar11->first).i = qVar4;
              ppVar10 = ppVar10 + 1;
              local_48.size = local_48.size + 1;
              ppVar11 = ppVar11 + 1;
            } while (ppVar10 < ppVar9);
          }
        }
        else if (0 < lVar8) {
          ppVar10 = this->ptr;
          ppVar9 = ppVar10 + lVar8;
          ppVar11 = local_48.ptr + local_48.size;
          do {
            iVar6 = (ppVar10->first).r;
            iVar7 = (ppVar10->first).c;
            qVar4 = (ppVar10->first).i;
            pMVar5 = ppVar10->second;
            (ppVar11->first).m.ptr = (ppVar10->first).m.ptr;
            ppVar11->second = pMVar5;
            (ppVar11->first).r = iVar6;
            (ppVar11->first).c = iVar7;
            (ppVar11->first).i = qVar4;
            ppVar10 = ppVar10 + 1;
            local_48.size = local_48.size + 1;
            ppVar11 = ppVar11 + 1;
          } while (ppVar10 < ppVar9);
        }
      }
      pQVar2 = &this->d->super_QArrayData;
      this->d = local_48.d;
      ppVar10 = this->ptr;
      this->ptr = local_48.ptr;
      puVar3 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = (Data *)pQVar2;
      local_48.ptr = ppVar10;
      local_48.size = (qsizetype)puVar3;
      if (old != (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                  *)0x0) {
        local_48.d = old->d;
        old->d = (Data *)pQVar2;
        local_48.ptr = old->ptr;
        old->ptr = ppVar10;
        local_48.size = old->size;
        old->size = (qsizetype)puVar3;
      }
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x20,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }